

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManSpecReduceInit_rec
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int f,int fDualOut)

{
  int iVar1;
  int iLit1;
  Gia_Obj_t *pGVar2;
  int fDualOut_local;
  int f_local;
  Vec_Int_t *vXorLits_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ObjCopyF(p,f,pObj);
  if (iVar1 == -1) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                    ,0x51f,
                    "void Gia_ManSpecReduceInit_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int, int)"
                   );
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    Gia_ManSpecReduceInit_rec(pNew,p,pGVar2,vXorLits,f,fDualOut);
    pGVar2 = Gia_ObjFanin1(pObj);
    Gia_ManSpecReduceInit_rec(pNew,p,pGVar2,vXorLits,f,fDualOut);
    iVar1 = Gia_ObjFanin0CopyF(p,f,pObj);
    iLit1 = Gia_ObjFanin1CopyF(p,f,pObj);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,iLit1);
    Gia_ObjSetCopyF(p,f,pObj,iVar1);
    Gia_ManSpecBuildInit(pNew,p,pObj,vXorLits,f,fDualOut);
  }
  return;
}

Assistant:

void Gia_ManSpecReduceInit_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int f, int fDualOut )
{
    if ( ~Gia_ObjCopyF(p, f, pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManSpecReduceInit_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, f, fDualOut );
    Gia_ManSpecReduceInit_rec( pNew, p, Gia_ObjFanin1(pObj), vXorLits, f, fDualOut );
    Gia_ObjSetCopyF( p, f, pObj, Gia_ManHashAnd(pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj)) );
    Gia_ManSpecBuildInit( pNew, p, pObj, vXorLits, f, fDualOut );
}